

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngstest.c
# Opt level: O3

void gpc_sGp(Pixel *out,Pixel *in,Background *back)

{
  uint uVar1;
  int iVar2;
  double dVar3;
  
  iVar2 = in->a;
  if (iVar2 < 0x81) {
    out->b = 0xff;
    out->r = 0xff;
    out->g = 0xff;
    uVar1 = 0;
  }
  else {
    dVar3 = ((double)in->b * 0.0722 + (double)in->r * 0.2126 + (double)in->g * 0.7152) /
            (double)iVar2;
    if (dVar3 <= 0.0031308) {
      dVar3 = dVar3 * 12.92;
    }
    else {
      dVar3 = pow(dVar3,0.4166666666666667);
      dVar3 = dVar3 * 1.055 + -0.055;
      iVar2 = in->a;
    }
    dVar3 = floor(dVar3 * 255.0 + 0.5);
    uVar1 = (int)dVar3 & 0xff;
    out->b = uVar1;
    out->g = uVar1;
    out->r = uVar1;
    dVar3 = floor((double)iVar2 / 257.0 + 0.5);
    uVar1 = (int)dVar3 & 0xff;
  }
  out->a = uVar1;
  return;
}

Assistant:

static void
gpc_sGp(Pixel *out, const Pixel *in, const Background *back)
{
   (void)back;

   if (in->a <= 128)
   {
      out->r = out->g = out->b = 255;
      out->a = 0;
   }

   else
   {
      out->r = out->g = out->b = sRGB(YfromRGBint(in->r, in->g, in->b)/in->a);
      out->a = u8d(in->a / 257.);
   }
}